

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void printVectors(int argc,char **argv)

{
  allocator local_89;
  string local_88;
  FastText fasttext;
  
  if (argc == 3) {
    fasttext.input_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x40);
    fasttext.model_.super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    fasttext.model_.super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    fasttext.output_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    fasttext.output_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    fasttext._0_32_ =
         ZEXT1632((undefined1  [16])
                  fasttext.input_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
    std::__cxx11::string::string((string *)&local_88,argv[2],&local_89);
    ::fasttext::FastText::loadModel(&fasttext,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    ::fasttext::FastText::printVectors(&fasttext);
    exit(0);
  }
  printPrintVectorsUsage();
  exit(1);
}

Assistant:

void printVectors(int argc, char** argv) {
  if (argc != 3) {
    printPrintVectorsUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(argv[2]));
  fasttext.printVectors();
  exit(0);
}